

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O3

void __thiscall sglr::rc::Texture::Texture(Texture *this,deUint32 name,Type type)

{
  (this->super_NamedObject).m_name = name;
  (this->super_NamedObject).m_refCount = 1;
  (this->super_NamedObject)._vptr_NamedObject = (_func_int **)&PTR__NamedObject_00784db8;
  this->m_type = type;
  this->m_immutable = false;
  (this->m_sampler).wrapS = REPEAT_GL;
  (this->m_sampler).wrapT = REPEAT_GL;
  (this->m_sampler).wrapR = REPEAT_GL;
  (this->m_sampler).minFilter = NEAREST_MIPMAP_LINEAR;
  (this->m_sampler).magFilter = LINEAR;
  (this->m_sampler).lodThreshold = 0.0;
  (this->m_sampler).normalizedCoords = true;
  (this->m_sampler).compare = COMPAREMODE_NONE;
  (this->m_sampler).compareChannel = 0;
  *(undefined8 *)&(this->m_sampler).borderColor.v = 0;
  *(undefined8 *)((long)&(this->m_sampler).borderColor.v + 8) = 0;
  (this->m_sampler).seamlessCubeMap = true;
  *(undefined8 *)&(this->m_sampler).depthStencilMode = 0;
  this->m_maxLevel = 1000;
  return;
}

Assistant:

NamedObject			(deUint32 name) : m_name(name), m_refCount(1) {}